

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

void bloaty::macho::ParseLoadCommand(LoadCommand *cmd,RangeSink *sink)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  macho *this;
  RangeSink *in_R8;
  char *pcVar7;
  char *pcVar8;
  uint64_t fileoff;
  ulong uVar9;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view label;
  
  uVar1 = cmd->cmd;
  if ((int)uVar1 < 0xb) {
    if (uVar1 != 0x80000022) {
      if (uVar1 == 1) {
        ParseSegment<segment_command,section>(*cmd,sink);
        return;
      }
      if (uVar1 != 2) {
        return;
      }
      if ((cmd->command_data)._M_len < 0x18) goto LAB_0019f3ee;
      pcVar5 = (cmd->command_data)._M_str;
      uVar3 = (cmd->file_data)._M_len;
      uVar4 = (ulong)*(uint *)(pcVar5 + 8);
      uVar2 = (ulong)*(uint *)(pcVar5 + 0xc) * ((ulong)cmd->is64bit * 4 + 0xc);
      if (uVar2 + uVar4 <= uVar3) {
        pcVar7 = (cmd->file_data)._M_str + uVar4;
        pcVar8 = (sink->file_->data_)._M_str;
        if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
          uVar9 = uVar3 - uVar4;
          if (uVar2 <= uVar3 - uVar4) {
            uVar9 = uVar2;
          }
          name._M_str = "Symbol Table";
          name._M_len = 0xc;
          RangeSink::AddFileRange(sink,"macho_symtab",name,(long)pcVar7 - (long)pcVar8,uVar9);
          uVar3 = (cmd->file_data)._M_len;
        }
        uVar4 = (ulong)*(uint *)(pcVar5 + 0x10);
        uVar2 = (ulong)*(uint *)(pcVar5 + 0x14);
        if (uVar3 < uVar2 + uVar4) goto LAB_0019f3dd;
        pcVar8 = (cmd->file_data)._M_str + uVar4;
        pcVar5 = (sink->file_->data_)._M_str;
        if (pcVar8 < pcVar5) {
          return;
        }
        if (pcVar5 + (sink->file_->data_)._M_len <= pcVar8) {
          return;
        }
        uVar9 = uVar3 - uVar4;
        if (uVar2 <= uVar3 - uVar4) {
          uVar9 = uVar2;
        }
        fileoff = (long)pcVar8 - (long)pcVar5;
        pcVar8 = "macho_symtab";
        pcVar5 = "String Table";
        sVar6 = 0xc;
        goto LAB_0019f105;
      }
      goto LAB_0019f3dd;
    }
switchD_0019eeec_caseD_22:
    if ((cmd->command_data)._M_len < 0x30) {
LAB_0019f3ee:
      Throw("Premature EOF reading Mach-O data.",0x36);
    }
    pcVar5 = (cmd->command_data)._M_str;
    sVar6 = (cmd->file_data)._M_len;
    uVar2 = (ulong)*(uint *)(pcVar5 + 8);
    uVar3 = (ulong)*(uint *)(pcVar5 + 0xc);
    if (uVar3 + uVar2 <= sVar6) {
      pcVar7 = (cmd->file_data)._M_str + uVar2;
      pcVar8 = (sink->file_->data_)._M_str;
      if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
        uVar4 = sVar6 - uVar2;
        if (uVar3 <= sVar6 - uVar2) {
          uVar4 = uVar3;
        }
        name_00._M_str = "Rebase Info";
        name_00._M_len = 0xb;
        RangeSink::AddFileRange(sink,"macho_dyld",name_00,(long)pcVar7 - (long)pcVar8,uVar4);
        sVar6 = (cmd->file_data)._M_len;
      }
      uVar2 = (ulong)*(uint *)(pcVar5 + 0x10);
      uVar3 = (ulong)*(uint *)(pcVar5 + 0x14);
      if (uVar3 + uVar2 <= sVar6) {
        pcVar7 = (cmd->file_data)._M_str + uVar2;
        pcVar8 = (sink->file_->data_)._M_str;
        if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
          uVar4 = sVar6 - uVar2;
          if (uVar3 <= sVar6 - uVar2) {
            uVar4 = uVar3;
          }
          name_01._M_str = "Binding Info";
          name_01._M_len = 0xc;
          RangeSink::AddFileRange(sink,"macho_dyld",name_01,(long)pcVar7 - (long)pcVar8,uVar4);
          sVar6 = (cmd->file_data)._M_len;
        }
        uVar2 = (ulong)*(uint *)(pcVar5 + 0x18);
        uVar3 = (ulong)*(uint *)(pcVar5 + 0x1c);
        if (uVar3 + uVar2 <= sVar6) {
          pcVar7 = (cmd->file_data)._M_str + uVar2;
          pcVar8 = (sink->file_->data_)._M_str;
          if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
            uVar4 = sVar6 - uVar2;
            if (uVar3 <= sVar6 - uVar2) {
              uVar4 = uVar3;
            }
            name_02._M_str = "Weak Binding Info";
            name_02._M_len = 0x11;
            RangeSink::AddFileRange(sink,"macho_dyld",name_02,(long)pcVar7 - (long)pcVar8,uVar4);
            sVar6 = (cmd->file_data)._M_len;
          }
          uVar2 = (ulong)*(uint *)(pcVar5 + 0x20);
          uVar3 = (ulong)*(uint *)(pcVar5 + 0x24);
          if (uVar3 + uVar2 <= sVar6) {
            pcVar7 = (cmd->file_data)._M_str + uVar2;
            pcVar8 = (sink->file_->data_)._M_str;
            if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
              uVar4 = sVar6 - uVar2;
              if (uVar3 <= sVar6 - uVar2) {
                uVar4 = uVar3;
              }
              name_03._M_str = "Lazy Binding Info";
              name_03._M_len = 0x11;
              RangeSink::AddFileRange(sink,"macho_dyld",name_03,(long)pcVar7 - (long)pcVar8,uVar4);
              sVar6 = (cmd->file_data)._M_len;
            }
            uVar2 = (ulong)*(uint *)(pcVar5 + 0x28);
            uVar3 = (ulong)*(uint *)(pcVar5 + 0x2c);
            if (uVar3 + uVar2 <= sVar6) {
              pcVar8 = (cmd->file_data)._M_str + uVar2;
              pcVar5 = (sink->file_->data_)._M_str;
              if (pcVar8 < pcVar5) {
                return;
              }
              if (pcVar5 + (sink->file_->data_)._M_len <= pcVar8) {
                return;
              }
              uVar9 = sVar6 - uVar2;
              if (uVar3 <= sVar6 - uVar2) {
                uVar9 = uVar3;
              }
              fileoff = (long)pcVar8 - (long)pcVar5;
              pcVar8 = "macho_dyld";
              pcVar5 = "Export Info";
              sVar6 = 0xb;
LAB_0019f105:
              name_04._M_str = pcVar5;
              name_04._M_len = sVar6;
              RangeSink::AddFileRange(sink,pcVar8,name_04,fileoff,uVar9);
              return;
            }
          }
        }
      }
    }
LAB_0019f3dd:
    Throw("region out-of-bounds",0x5d);
  }
  switch(uVar1) {
  case 0x19:
    ParseSegment<segment_command_64,section_64>(*cmd,sink);
switchD_0019eea3_caseD_27:
    return;
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1f:
  case 0x20:
  case 0x21:
    goto switchD_0019eea3_caseD_27;
  case 0x1d:
    pcVar5 = "Code Signature";
    this = (macho *)0xe;
    goto LAB_0019f3cc;
  case 0x1e:
    pcVar5 = "Segment Split Info";
LAB_0019f3ab:
    this = (macho *)0x12;
    goto LAB_0019f3cc;
  case 0x22:
    goto switchD_0019eeec_caseD_22;
  default:
    switch(uVar1) {
    case 0x26:
      pcVar5 = "Function Start Addresses";
      this = (macho *)0x18;
      break;
    case 0x27:
    case 0x28:
    case 0x2a:
    case 0x2c:
    case 0x2d:
      goto switchD_0019eea3_caseD_27;
    case 0x29:
      pcVar5 = "Table of Non-instructions";
      this = (macho *)0x19;
      break;
    case 0x2b:
      pcVar5 = "Code Signing DRs";
      this = (macho *)0x10;
      break;
    case 0x2e:
      pcVar5 = "Optimization Hints";
      goto LAB_0019f3ab;
    default:
      if (uVar1 == 0xb) {
        if (0x4f < (cmd->command_data)._M_len) {
          pcVar5 = (cmd->command_data)._M_str;
          sVar6 = (cmd->file_data)._M_len;
          uVar3 = (ulong)*(uint *)(pcVar5 + 0x20);
          if (uVar3 + (ulong)*(uint *)(pcVar5 + 0x24) * 8 <= sVar6) {
            pcVar7 = (cmd->file_data)._M_str + uVar3;
            pcVar8 = (sink->file_->data_)._M_str;
            if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
              uVar4 = (ulong)*(uint *)(pcVar5 + 0x24) << 3;
              uVar2 = sVar6 - uVar3;
              if (uVar4 <= sVar6 - uVar3) {
                uVar2 = uVar4;
              }
              name_05._M_str = "Table of Contents";
              name_05._M_len = 0x11;
              RangeSink::AddFileRange
                        (sink,"macho_dynsymtab",name_05,(long)pcVar7 - (long)pcVar8,uVar2);
              sVar6 = (cmd->file_data)._M_len;
            }
            uVar3 = (ulong)*(uint *)(pcVar5 + 0x28);
            uVar2 = (ulong)*(uint *)(pcVar5 + 0x2c) * 0x38;
            if (uVar2 + uVar3 <= sVar6) {
              pcVar7 = (cmd->file_data)._M_str + uVar3;
              pcVar8 = (sink->file_->data_)._M_str;
              if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
                uVar4 = sVar6 - uVar3;
                if (uVar2 <= sVar6 - uVar3) {
                  uVar4 = uVar2;
                }
                name_06._M_str = "Module Table";
                name_06._M_len = 0xc;
                RangeSink::AddFileRange
                          (sink,"macho_dynsymtab",name_06,(long)pcVar7 - (long)pcVar8,uVar4);
                sVar6 = (cmd->file_data)._M_len;
              }
              uVar3 = (ulong)*(uint *)(pcVar5 + 0x30);
              if (uVar3 + (ulong)*(uint *)(pcVar5 + 0x34) * 4 <= sVar6) {
                pcVar7 = (cmd->file_data)._M_str + uVar3;
                pcVar8 = (sink->file_->data_)._M_str;
                if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
                  uVar4 = (ulong)*(uint *)(pcVar5 + 0x34) << 2;
                  uVar2 = sVar6 - uVar3;
                  if (uVar4 <= sVar6 - uVar3) {
                    uVar2 = uVar4;
                  }
                  name_07._M_str = "Referenced Symbol Table";
                  name_07._M_len = 0x17;
                  RangeSink::AddFileRange
                            (sink,"macho_dynsymtab",name_07,(long)pcVar7 - (long)pcVar8,uVar2);
                  sVar6 = (cmd->file_data)._M_len;
                }
                uVar3 = (ulong)*(uint *)(pcVar5 + 0x38);
                if (uVar3 + (ulong)*(uint *)(pcVar5 + 0x3c) * 4 <= sVar6) {
                  pcVar7 = (cmd->file_data)._M_str + uVar3;
                  pcVar8 = (sink->file_->data_)._M_str;
                  if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
                    uVar4 = (ulong)*(uint *)(pcVar5 + 0x3c) << 2;
                    uVar2 = sVar6 - uVar3;
                    if (uVar4 <= sVar6 - uVar3) {
                      uVar2 = uVar4;
                    }
                    name_08._M_str = "Indirect Symbol Table";
                    name_08._M_len = 0x15;
                    RangeSink::AddFileRange
                              (sink,"macho_dynsymtab",name_08,(long)pcVar7 - (long)pcVar8,uVar2);
                    sVar6 = (cmd->file_data)._M_len;
                  }
                  uVar3 = (ulong)*(uint *)(pcVar5 + 0x40);
                  if (uVar3 + (ulong)*(uint *)(pcVar5 + 0x44) * 8 <= sVar6) {
                    pcVar7 = (cmd->file_data)._M_str + uVar3;
                    pcVar8 = (sink->file_->data_)._M_str;
                    if ((pcVar8 <= pcVar7) && (pcVar7 < pcVar8 + (sink->file_->data_)._M_len)) {
                      uVar4 = (ulong)*(uint *)(pcVar5 + 0x44) << 3;
                      uVar2 = sVar6 - uVar3;
                      if (uVar4 <= sVar6 - uVar3) {
                        uVar2 = uVar4;
                      }
                      name_09._M_str = "External Relocation Entries";
                      name_09._M_len = 0x1b;
                      RangeSink::AddFileRange
                                (sink,"macho_dynsymtab",name_09,(long)pcVar7 - (long)pcVar8,uVar2);
                      sVar6 = (cmd->file_data)._M_len;
                    }
                    uVar3 = (ulong)*(uint *)(pcVar5 + 0x48);
                    if (uVar3 + (ulong)*(uint *)(pcVar5 + 0x4c) * 8 <= sVar6) {
                      pcVar7 = (cmd->file_data)._M_str + uVar3;
                      pcVar8 = (sink->file_->data_)._M_str;
                      if (pcVar7 < pcVar8) {
                        return;
                      }
                      if (pcVar8 + (sink->file_->data_)._M_len <= pcVar7) {
                        return;
                      }
                      uVar2 = (ulong)*(uint *)(pcVar5 + 0x4c) << 3;
                      uVar9 = sVar6 - uVar3;
                      if (uVar2 <= sVar6 - uVar3) {
                        uVar9 = uVar2;
                      }
                      fileoff = (long)pcVar7 - (long)pcVar8;
                      pcVar8 = "macho_dynsymtab";
                      pcVar5 = "Local Relocation Entries";
                      sVar6 = 0x18;
                      goto LAB_0019f105;
                    }
                  }
                }
              }
            }
          }
          goto LAB_0019f3dd;
        }
        goto LAB_0019f3ee;
      }
      goto switchD_0019eea3_caseD_27;
    }
LAB_0019f3cc:
    label._M_str = &cmd->is64bit;
    label._M_len = (size_t)pcVar5;
    ParseLinkeditCommand(this,label,(LoadCommand *)sink,in_R8);
    return;
  }
}

Assistant:

void ParseLoadCommand(const LoadCommand& cmd, RangeSink* sink) {
  switch (cmd.cmd) {
    case LC_SEGMENT_64:
      ParseSegment<segment_command_64, section_64>(cmd, sink);
      break;
    case LC_SEGMENT:
      ParseSegment<segment_command, section>(cmd, sink);
      break;
    case LC_DYLD_INFO:
    case LC_DYLD_INFO_ONLY:
      ParseDyldInfo(cmd, sink);
      break;
    case LC_SYMTAB:
      ParseSymbolTable(cmd, sink);
      break;
    case LC_DYSYMTAB:
      ParseDynamicSymbolTable(cmd, sink);
      break;
    case LC_CODE_SIGNATURE:
      ParseLinkeditCommand("Code Signature", cmd, sink);
      break;
    case LC_SEGMENT_SPLIT_INFO:
      ParseLinkeditCommand("Segment Split Info", cmd, sink);
      break;
    case LC_FUNCTION_STARTS:
      ParseLinkeditCommand("Function Start Addresses", cmd, sink);
      break;
    case LC_DATA_IN_CODE:
      ParseLinkeditCommand("Table of Non-instructions", cmd, sink);
      break;
    case LC_DYLIB_CODE_SIGN_DRS:
      ParseLinkeditCommand("Code Signing DRs", cmd, sink);
      break;
    case LC_LINKER_OPTIMIZATION_HINT:
      ParseLinkeditCommand("Optimization Hints", cmd, sink);
      break;
  }
}